

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSwizzleCase::test
          (TextureSwizzleCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLint param;
  uint uVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  ScopedLogSection section;
  GLint value;
  ScopedLogSection section_1;
  ScopedLogSection local_f0;
  long local_e8;
  TestLog local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  GLuint local_4c;
  code *local_48;
  GLenum local_40;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  uVar1 = GVar5 - 0x753f;
  if (2 < GVar5 - 0x8e42) {
    uVar1 = -(uint)(GVar5 != 0x8e45) | 0x1906;
  }
  if (bVar4 == false) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Initial","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar2,&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,uVar1,
               (this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_f0.m_log);
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Set","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar2,&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 == false) {
    lVar11 = 0;
    do {
      param = *(GLint *)((long)&DAT_01cf9020 + lVar11);
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,param);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar9 = 0xf;
        if (local_90 != local_80) {
          uVar9 = local_80[0];
        }
        if (uVar9 < local_70._M_string_length + local_88) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar10 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_70._M_string_length + local_88) goto LAB_0186e928;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_0186e928:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_e0.m_log = pTVar2->m_log;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0.m_log = pTVar2->m_log;
          local_f0.m_log = (TestLog *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 param,(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
    lVar11 = 0;
    do {
      uVar1 = *(uint *)((long)&DAT_01cf9020 + lVar11);
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)uVar1);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar9 = 0xf;
        if (local_90 != local_80) {
          uVar9 = local_80[0];
        }
        if (uVar9 < local_70._M_string_length + local_88) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar10 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_70._M_string_length + local_88) goto LAB_0186ebea;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_0186ebea:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_e0.m_log = pTVar2->m_log;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0.m_log = pTVar2->m_log;
          local_f0.m_log = (TestLog *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 uVar1,(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
  }
  else {
    lVar11 = 0;
    do {
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        local_4c = *(GLuint *)((long)&DAT_01cf9020 + lVar11);
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_4c);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
          uVar9 = 0xf;
          if (local_90 != local_80) {
            uVar9 = local_80[0];
          }
          if (uVar9 < local_70._M_string_length + local_88) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              uVar10 = local_70.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_70._M_string_length + local_88) goto LAB_0186e45f;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
          }
          else {
LAB_0186e45f:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
          }
          local_f0.m_log = &local_e0;
          pTVar2 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar2) {
            local_e0.m_log = pTVar2->m_log;
            lStack_d8 = plVar6[3];
          }
          else {
            local_e0.m_log = pTVar2->m_log;
            local_f0.m_log = (TestLog *)*plVar6;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)pTVar2;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar2->m_log = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_b0.field_2._M_allocated_capacity = *psVar8;
            local_b0.field_2._8_8_ = plVar6[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar8;
            local_b0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar8;
            local_d0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_d0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_d0);
          goto LAB_0186e791;
        }
      }
      else {
        local_4c = *(GLuint *)((long)&DAT_01cf9020 + lVar11);
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_4c
                  );
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 == 0) goto LAB_0186e821;
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar9 = 0xf;
        if (local_90 != local_80) {
          uVar9 = local_80[0];
        }
        if (uVar9 < local_70._M_string_length + local_88) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar10 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_70._M_string_length + local_88) goto LAB_0186e555;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_0186e555:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_e0.m_log = pTVar2->m_log;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0.m_log = pTVar2->m_log;
          local_f0.m_log = (TestLog *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0.field_2._8_8_ = puVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar8;
          local_b0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = plVar6[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
LAB_0186e791:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
LAB_0186e821:
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 *(int *)((long)&DAT_01cf9020 + lVar11),(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void TextureSwizzleCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_SWIZZLE_R) ? (GL_RED) :
								  (m_pname == GL_TEXTURE_SWIZZLE_G) ? (GL_GREEN) :
								  (m_pname == GL_TEXTURE_SWIZZLE_B) ? (GL_BLUE) :
								  (m_pname == GL_TEXTURE_SWIZZLE_A) ? (GL_ALPHA) :
								  (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				swizzleValues[]	= {GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA, GL_ZERO, GL_ONE};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)swizzleValues[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = swizzleValues[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
	}
}